

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  LoopGenerateSyntax *pLVar1;
  Token *unaff_R15;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  Token *in_stack_00000010;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  BumpAllocator *in_stack_00000038;
  Token *in_stack_00000040;
  Token *in_stack_00000060;
  ExpressionSyntax *in_stack_00000068;
  Token *in_stack_00000070;
  ExpressionSyntax *in_stack_00000078;
  Token *in_stack_00000080;
  ExpressionSyntax *in_stack_00000088;
  Token *in_stack_00000090;
  MemberSyntax *in_stack_00000098;
  BumpAllocator *in_stack_fffffffffffffee8;
  MemberSyntax *in_stack_fffffffffffffef0;
  undefined1 in_stack_ffffffffffffff98 [16];
  
  deepClone<slang::syntax::AttributeInstanceSyntax>
            (in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98._0_8_);
  parsing::Token::deepClone(in_stack_00000040,in_stack_00000038);
  parsing::Token::deepClone(in_stack_00000040,in_stack_00000038);
  parsing::Token::deepClone(in_stack_00000040,in_stack_00000038);
  parsing::Token::deepClone(in_stack_00000040,in_stack_00000038);
  parsing::Token::deepClone(in_stack_00000040,in_stack_00000038);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa36b72);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  parsing::Token::deepClone(in_stack_00000040,in_stack_00000038);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa36bc5);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  parsing::Token::deepClone(in_stack_00000040,in_stack_00000038);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa36c12);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  parsing::Token::deepClone(in_stack_00000040,in_stack_00000038);
  not_null<slang::syntax::MemberSyntax_*>::operator*
            ((not_null<slang::syntax::MemberSyntax_*> *)0xa36c61);
  deepClone<slang::syntax::MemberSyntax>(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  pLVar1 = BumpAllocator::
           emplace<slang::syntax::LoopGenerateSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::MemberSyntax&>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,unaff_R15,in_stack_00000060,in_stack_00000068,in_stack_00000070,
                      in_stack_00000078,in_stack_00000080,in_stack_00000088,in_stack_00000090,
                      in_stack_00000098);
  return (int)pLVar1;
}

Assistant:

static SyntaxNode* clone(const LoopGenerateSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<LoopGenerateSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        node.genvar.deepClone(alloc),
        node.identifier.deepClone(alloc),
        node.equals.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.initialExpr, alloc),
        node.semi1.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.stopExpr, alloc),
        node.semi2.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.iterationExpr, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<MemberSyntax>(*node.block, alloc)
    );
}